

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol_tests.cpp
# Opt level: O0

void __thiscall torcontrol_tests::util_SplitTorReplyLine::test_method(util_SplitTorReplyLine *this)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  allocator<char> *in_stack_fffffffffffffb48;
  allocator<char> *__a;
  char *in_stack_fffffffffffffb50;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffb78;
  string *args;
  string *in_stack_fffffffffffffb80;
  string *command;
  string *in_stack_fffffffffffffb88;
  string *input;
  allocator<char> local_3e6;
  allocator<char> local_3e5;
  allocator<char> local_3e4;
  allocator<char> local_3e3;
  allocator<char> local_3e2;
  allocator<char> local_3e1;
  allocator<char> local_3e0;
  allocator<char> local_3df;
  allocator<char> local_3de;
  undefined1 local_3dd [2];
  allocator<char> local_3db;
  allocator<char> local_3da;
  undefined1 local_3d9;
  undefined1 local_3d8;
  undefined1 local_3d7 [2];
  allocator<char> local_3d5;
  allocator<char> local_3d4;
  allocator<char> local_3d3;
  allocator<char> local_3d2;
  allocator<char> local_3d1;
  allocator<char> local_3d0;
  allocator<char> local_3cf;
  allocator<char> local_3ce;
  allocator<char> local_3cd;
  allocator<char> local_3cc;
  allocator<char> local_3cb;
  allocator<char> local_3ca;
  allocator<char> local_3c9 [961];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3cb);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3ca);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3ce);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3cd);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3cf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine
            (in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d4);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d3);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  input = (string *)local_3d7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine(input,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)local_3d7);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)(local_3d7 + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3d5);
  command = (string *)&local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  args = (string *)&local_3d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine(input,command,args);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3da);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3dd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  CheckSplitTorReplyLine(input,command,args);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)local_3dd);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator((allocator<char> *)(local_3dd + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3db);
  __s = &local_3de;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffb48);
  __a = &local_3df;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CheckSplitTorReplyLine(input,command,args);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e0);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3df);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3de);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CheckSplitTorReplyLine(input,command,args);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e3);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e2);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  CheckSplitTorReplyLine(input,command,args);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e6);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e5);
  std::__cxx11::string::~string(in_stack_fffffffffffffb08);
  std::allocator<char>::~allocator(&local_3e4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_SplitTorReplyLine)
{
    // Data we should receive during normal usage
    CheckSplitTorReplyLine(
        "PROTOCOLINFO PIVERSION",
        "PROTOCOLINFO", "PIVERSION");
    CheckSplitTorReplyLine(
        "AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"",
        "AUTH", "METHODS=COOKIE,SAFECOOKIE COOKIEFILE=\"/home/x/.tor/control_auth_cookie\"");
    CheckSplitTorReplyLine(
        "AUTH METHODS=NULL",
        "AUTH", "METHODS=NULL");
    CheckSplitTorReplyLine(
        "AUTH METHODS=HASHEDPASSWORD",
        "AUTH", "METHODS=HASHEDPASSWORD");
    CheckSplitTorReplyLine(
        "VERSION Tor=\"0.2.9.8 (git-a0df013ea241b026)\"",
        "VERSION", "Tor=\"0.2.9.8 (git-a0df013ea241b026)\"");
    CheckSplitTorReplyLine(
        "AUTHCHALLENGE SERVERHASH=aaaa SERVERNONCE=bbbb",
        "AUTHCHALLENGE", "SERVERHASH=aaaa SERVERNONCE=bbbb");

    // Other valid inputs
    CheckSplitTorReplyLine("COMMAND", "COMMAND", "");
    CheckSplitTorReplyLine("COMMAND SOME  ARGS", "COMMAND", "SOME  ARGS");

    // These inputs are valid because PROTOCOLINFO accepts an OtherLine that is
    // just an OptArguments, which enables multiple spaces to be present
    // between the command and arguments.
    CheckSplitTorReplyLine("COMMAND  ARGS", "COMMAND", " ARGS");
    CheckSplitTorReplyLine("COMMAND   EVEN+more  ARGS", "COMMAND", "  EVEN+more  ARGS");
}